

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O3

string * __thiscall
AssemblyCode::CallCommand::ToString_abi_cxx11_(string *__return_storage_ptr__,CallCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pCVar2;
  pointer pcVar3;
  string *psVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  pointer pCVar8;
  string command;
  CTemp argument;
  string local_b8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string *local_58;
  string local_50;
  
  IRT::CLabel::ToString_abi_cxx11_(&local_b8,&this->address);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x15daf1);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_68 = *plVar6;
    lStack_60 = plVar5[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar6;
    local_78 = (long *)*plVar5;
  }
  local_70 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_98 = &local_88;
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_88 = *plVar6;
    lStack_80 = plVar5[3];
  }
  else {
    local_88 = *plVar6;
    local_98 = (long *)*plVar5;
  }
  local_90 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  paVar1 = &local_b8.field_2;
  local_58 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  pCVar8 = (this->arguments).super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (this->arguments).super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar8 != pCVar2) {
    do {
      pcVar3 = (pCVar8->name)._M_dataplus._M_p;
      local_78 = &local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar3,pcVar3 + (pCVar8->name)._M_string_length);
      IRT::CTemp::ToString_abi_cxx11_(&local_50,(CTemp *)&local_78);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8.field_2._8_8_ = plVar5[3];
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_b8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      pCVar8 = pCVar8 + 1;
    } while (pCVar8 != pCVar2);
  }
  psVar4 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)local_58,local_98,local_90 + (long)local_98);
  std::__cxx11::string::append((char *)psVar4);
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  return psVar4;
}

Assistant:

std::string AssemblyCode::CallCommand::ToString( ) const {
    std::string command = "call (" + address.ToString( ) + ") ";
    for ( auto argument : arguments ) {
        command += argument.ToString( ) + " ";
    }
    return command + "\n";
}